

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  Colour colour;
  char local_1a [2];
  
  local_1a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,local_1a,1)
  ;
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam0000000000186f00 = 0x7e7e7e7e7e7e7e;
    uRam0000000000186f07._0_1_ = '~';
    uRam0000000000186f07._1_1_ = '~';
    uRam0000000000186f07._2_1_ = '~';
    uRam0000000000186f07._3_1_ = '~';
    uRam0000000000186f07._4_1_ = '~';
    uRam0000000000186f07._5_1_ = '~';
    uRam0000000000186f07._6_1_ = '~';
    uRam0000000000186f07._7_1_ = '~';
    DAT_00186ef0 = '~';
    DAT_00186ef0_1._0_1_ = '~';
    DAT_00186ef0_1._1_1_ = '~';
    DAT_00186ef0_1._2_1_ = '~';
    DAT_00186ef0_1._3_1_ = '~';
    DAT_00186ef0_1._4_1_ = '~';
    DAT_00186ef0_1._5_1_ = '~';
    DAT_00186ef0_1._6_1_ = '~';
    uRam0000000000186ef8 = 0x7e7e7e7e7e7e7e;
    DAT_00186eff = 0x7e;
    DAT_00186ee0 = '~';
    DAT_00186ee0_1._0_1_ = '~';
    DAT_00186ee0_1._1_1_ = '~';
    DAT_00186ee0_1._2_1_ = '~';
    DAT_00186ee0_1._3_1_ = '~';
    DAT_00186ee0_1._4_1_ = '~';
    DAT_00186ee0_1._5_1_ = '~';
    DAT_00186ee0_1._6_1_ = '~';
    uRam0000000000186ee8._0_1_ = '~';
    uRam0000000000186ee8._1_1_ = '~';
    uRam0000000000186ee8._2_1_ = '~';
    uRam0000000000186ee8._3_1_ = '~';
    uRam0000000000186ee8._4_1_ = '~';
    uRam0000000000186ee8._5_1_ = '~';
    uRam0000000000186ee8._6_1_ = '~';
    uRam0000000000186ee8._7_1_ = '~';
    DAT_00186ed0 = '~';
    DAT_00186ed0_1._0_1_ = '~';
    DAT_00186ed0_1._1_1_ = '~';
    DAT_00186ed0_1._2_1_ = '~';
    DAT_00186ed0_1._3_1_ = '~';
    DAT_00186ed0_1._4_1_ = '~';
    DAT_00186ed0_1._5_1_ = '~';
    DAT_00186ed0_1._6_1_ = '~';
    uRam0000000000186ed8._0_1_ = '~';
    uRam0000000000186ed8._1_1_ = '~';
    uRam0000000000186ed8._2_1_ = '~';
    uRam0000000000186ed8._3_1_ = '~';
    uRam0000000000186ed8._4_1_ = '~';
    uRam0000000000186ed8._5_1_ = '~';
    uRam0000000000186ed8._6_1_ = '~';
    uRam0000000000186ed8._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam0000000000186ec8._0_1_ = '~';
    uRam0000000000186ec8._1_1_ = '~';
    uRam0000000000186ec8._2_1_ = '~';
    uRam0000000000186ec8._3_1_ = '~';
    uRam0000000000186ec8._4_1_ = '~';
    uRam0000000000186ec8._5_1_ = '~';
    uRam0000000000186ec8._6_1_ = '~';
    uRam0000000000186ec8._7_1_ = '~';
    DAT_00186f0f = 0;
  }
  sVar4 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,&getLineOfChars<(char)126>()::line,sVar4);
  local_1a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1a + 1,1);
  Colour::use(FileName);
  pTVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.
           super_Option<Catch::TestRunInfo>.nullableValue;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                      (pTVar1->name)._M_dataplus._M_p,(pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is a Catch v",0xd);
  libraryVersion();
  operator<<(poVar3,&libraryVersion::version);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Run with -? for options\n\n",0x19);
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Randomness seeded to: ",0x16);
    (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
  }
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used = true;
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}